

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall glu::sl::ShaderParser::~ShaderParser(ShaderParser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  Resource *pRVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  pcVar1 = (this->m_curTokenStr)._M_dataplus._M_p;
  paVar4 = &(this->m_curTokenStr).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->m_input).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  pRVar3 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  if (pRVar3 != (Resource *)0x0) {
    (*pRVar3->_vptr_Resource[1])();
    (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
    ptr = (Resource *)0x0;
  }
  pcVar1 = (this->m_filename)._M_dataplus._M_p;
  paVar4 = &(this->m_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ShaderParser::~ShaderParser (void)
{
}